

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::prelu(tensor *dest,tensor *src,tensor *param)

{
  float fVar1;
  int iVar2;
  float *pfVar3;
  long lVar4;
  undefined4 extraout_var;
  size_t sVar5;
  long *in_RDX;
  long *in_RSI;
  tensor *in_RDI;
  size_t i;
  float *d;
  float *s;
  float p;
  ulong local_38;
  
  pfVar3 = (float *)(**(code **)(*in_RDX + 0x10))();
  fVar1 = *pfVar3;
  lVar4 = (**(code **)(*in_RSI + 0x10))();
  iVar2 = (*in_RDI->_vptr_tensor[3])();
  local_38 = 0;
  while( true ) {
    sVar5 = tensor::size(in_RDI);
    if (sVar5 <= local_38) break;
    if (*(float *)(lVar4 + local_38 * 4) <= 0.0) {
      *(float *)(CONCAT44(extraout_var,iVar2) + local_38 * 4) =
           fVar1 * *(float *)(lVar4 + local_38 * 4);
    }
    else {
      *(undefined4 *)(CONCAT44(extraout_var,iVar2) + local_38 * 4) =
           *(undefined4 *)(lVar4 + local_38 * 4);
    }
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void prelu (
            tensor& dest,
            const tensor& src,
            const tensor& param
        )
        {
            const float p = param.host()[0];
            const float* s = src.host();
            float* d = dest.host();
            for (size_t i = 0; i < dest.size(); ++i)
            {
                if (s[i] > 0)
                    d[i] = s[i];
                else
                    d[i] = p*s[i];
            }
        }